

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool tinyxml2::XMLUtil::ToInt(char *str,int *value)

{
  bool bVar1;
  int iVar2;
  int local_24;
  int *piStack_20;
  uint v;
  int *value_local;
  char *str_local;
  
  piStack_20 = value;
  value_local = (int *)str;
  bVar1 = IsPrefixHex(str);
  if (bVar1) {
    iVar2 = __isoc99_sscanf(value_local,"%x",&local_24);
    if (iVar2 == 1) {
      *piStack_20 = local_24;
      return true;
    }
  }
  else {
    iVar2 = __isoc99_sscanf(value_local,"%d",piStack_20);
    if (iVar2 == 1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool XMLUtil::ToInt(const char* str, int* value)
{
    if (IsPrefixHex(str)) {
        unsigned v;
        if (TIXML_SSCANF(str, "%x", &v) == 1) {
            *value = static_cast<int>(v);
            return true;
        }
    }
    else {
        if (TIXML_SSCANF(str, "%d", value) == 1) {
            return true;
        }
    }
    return false;
}